

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::detail::
message_digest<SHA256state_st,int(*)(SHA256state_st*),int(*)(SHA256state_st*,void_const*,unsigned_long),int(*)(unsigned_char*,SHA256state_st*)>
          (string *__return_storage_ptr__,detail *this,string *s,_func_int_SHA256state_st_ptr *init,
          _func_int_SHA256state_st_ptr_void_ptr_unsigned_long *update,
          _func_int_uchar_ptr_SHA256state_st_ptr *final,size_t digest_length)

{
  long lVar1;
  ostream *poVar2;
  unsigned_long extraout_RDX;
  pointer puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> md;
  SHA256state_st ctx;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  ss = (stringstream)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&md,(size_type)final,(value_type_conflict3 *)&ss,(allocator_type *)&ctx);
  (*(code *)s)(&ctx);
  (*init)(&ctx);
  (*update)((SHA256state_st *)
            md.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,&ctx,extraout_RDX);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (puVar3 = md.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 != md.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,0x30);
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&md.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

inline std::string message_digest(const std::string &s, Init init,
                                  Update update, Final final,
                                  size_t digest_length) {
  using namespace std;

  std::vector<unsigned char> md(digest_length, 0);
  CTX ctx;
  init(&ctx);
  update(&ctx, s.data(), s.size());
  final(md.data(), &ctx);

  stringstream ss;
  for (auto c : md) {
    ss << setfill('0') << setw(2) << hex << (unsigned int)c;
  }
  return ss.str();
}